

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O3

string * __thiscall
ut11::Mock<bool(int)>::GetVerifyFailTimesMessageForCount_abi_cxx11_
          (string *__return_storage_ptr__,Mock<bool(int)> *this,size_t expected,size_t actual)

{
  ostream *poVar1;
  stringstream output;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Expected function to be called ",0x1f);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," times was actually called ",0x1b);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," times",6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string GetVerifyFailTimesMessageForCount(std::size_t expected, std::size_t actual) const
		{
			std::stringstream output;
			output << "Expected function to be called " << expected << " times was actually called " << actual << " times";
			return output.str();
		}